

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O1

XXH64_hash_t
XXH3_64bits_internal
          (void *input,size_t len,XXH64_hash_t seed64,void *secret,size_t secretLen,
          XXH3_hashLong64_f f_hashLong)

{
  ulong *puVar1;
  long *plVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uint uVar29;
  XXH64_hash_t XVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  uint uVar34;
  long lVar35;
  long lVar36;
  undefined1 auVar37 [16];
  
  if (len < 0x11) {
    if (len < 9) {
      if (3 < len) {
        XVar30 = XXH3_len_4to8_64b((xxh_u8 *)input,len,(xxh_u8 *)secret,seed64);
        return XVar30;
      }
      if (len != 0) {
        XVar30 = XXH3_len_1to3_64b((xxh_u8 *)input,len,(xxh_u8 *)secret,seed64);
        return XVar30;
      }
      uVar31 = *(ulong *)((long)secret + 0x38) ^ *(ulong *)((long)secret + 0x40) ^ seed64;
      uVar31 = (uVar31 >> 0x21 ^ uVar31) * -0x3d4d51c2d82b14b1;
      uVar31 = (uVar31 >> 0x1d ^ uVar31) * 0x165667b19e3779f9;
      return uVar31 >> 0x20 ^ uVar31;
    }
    uVar32 = (*(ulong *)((long)secret + 0x20) ^ *(ulong *)((long)secret + 0x18)) + seed64 ^ *input;
    uVar31 = (*(ulong *)((long)secret + 0x30) ^ *(ulong *)((long)secret + 0x28)) - seed64 ^
             *(ulong *)((long)input + (len - 8));
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar31;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar32;
    uVar31 = (SUB168(auVar3 * auVar16,8) ^ SUB168(auVar3 * auVar16,0)) +
             len + uVar31 +
             (uVar32 >> 0x38 | (uVar32 & 0xff000000000000) >> 0x28 |
              (uVar32 & 0xff0000000000) >> 0x18 | (uVar32 & 0xff00000000) >> 8 |
              (uVar32 & 0xff000000) << 8 | (uVar32 & 0xff0000) << 0x18 | (uVar32 & 0xff00) << 0x28 |
             uVar32 << 0x38);
  }
  else {
    if (0x80 < len) {
      if (len < 0xf1) {
        lVar33 = len * -0x61c8864e7a143579;
        lVar36 = 0;
        auVar37._8_4_ = (int)seed64;
        auVar37._0_8_ = seed64;
        auVar37._12_4_ = (int)(seed64 >> 0x20);
        lVar35 = 0;
        do {
          puVar1 = (ulong *)((long)input + lVar35 + 0x10);
          plVar2 = (long *)((long)secret + lVar35 + 0x10);
          auVar12._8_8_ = 0;
          auVar12._0_8_ =
               ((long *)((long)secret + lVar35))[1] - seed64 ^ ((ulong *)((long)input + lVar35))[1];
          auVar25._8_8_ = 0;
          auVar25._0_8_ =
               *(long *)((long)secret + lVar35) + seed64 ^ *(ulong *)((long)input + lVar35);
          auVar13._8_8_ = 0;
          auVar13._0_8_ = plVar2[1] - auVar37._8_8_ ^ puVar1[1];
          auVar26._8_8_ = 0;
          auVar26._0_8_ = *plVar2 + auVar37._8_8_ ^ *puVar1;
          lVar33 = lVar33 + (SUB168(auVar12 * auVar25,8) ^ SUB168(auVar12 * auVar25,0));
          lVar36 = lVar36 + (SUB168(auVar13 * auVar26,8) ^ SUB168(auVar13 * auVar26,0));
          lVar35 = lVar35 + 0x20;
        } while (lVar35 != 0x80);
        uVar31 = ((ulong)(lVar36 + lVar33) >> 0x25 ^ lVar36 + lVar33) * 0x165667919e3779f9;
        uVar31 = uVar31 >> 0x20 ^ uVar31;
        if (0x8f < len) {
          uVar29 = (uint)(len >> 4) & 0xfffffff;
          uVar34 = 9;
          if (9 < uVar29) {
            uVar34 = uVar29;
          }
          lVar33 = 0;
          do {
            auVar14._8_8_ = 0;
            auVar14._0_8_ =
                 *(long *)((long)secret + lVar33 + 0xb) - seed64 ^
                 *(ulong *)((long)input + lVar33 + 0x88);
            auVar27._8_8_ = 0;
            auVar27._0_8_ =
                 *(long *)((long)secret + lVar33 + 3) + seed64 ^
                 *(ulong *)((long)input + lVar33 + 0x80);
            uVar31 = uVar31 + (SUB168(auVar14 * auVar27,8) ^ SUB168(auVar14 * auVar27,0));
            lVar33 = lVar33 + 0x10;
          } while ((ulong)(uVar34 << 4) - 0x80 != lVar33);
        }
        auVar15._8_8_ = 0;
        auVar15._0_8_ =
             *(long *)((long)secret + 0x7f) - seed64 ^ *(ulong *)((long)input + (len - 8));
        auVar28._8_8_ = 0;
        auVar28._0_8_ =
             *(long *)((long)secret + 0x77) + seed64 ^ *(ulong *)((long)input + (len - 0x10));
        uVar31 = (SUB168(auVar15 * auVar28,8) ^ SUB168(auVar15 * auVar28,0)) + uVar31;
        uVar31 = (uVar31 >> 0x25 ^ uVar31) * 0x165667919e3779f9;
        return uVar31 >> 0x20 ^ uVar31;
      }
      XVar30 = (*f_hashLong)(input,len,seed64,(xxh_u8 *)secret,secretLen);
      return XVar30;
    }
    lVar33 = len * -0x61c8864e7a143579;
    if (0x20 < len) {
      if (0x40 < len) {
        if (0x60 < len) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(long *)((long)secret + 0x68) - seed64 ^ *(ulong *)((long)input + 0x38);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = *(long *)((long)secret + 0x60) + seed64 ^ *(ulong *)((long)input + 0x30);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(long *)((long)secret + 0x78) - seed64 ^
                         *(ulong *)((long)input + (len - 0x38));
          auVar18._8_8_ = 0;
          auVar18._0_8_ =
               *(long *)((long)secret + 0x70) + seed64 ^ *(ulong *)((long)input + (len - 0x40));
          lVar33 = lVar33 + (SUB168(auVar4 * auVar17,8) ^ SUB168(auVar4 * auVar17,0)) +
                   (SUB168(auVar5 * auVar18,8) ^ SUB168(auVar5 * auVar18,0));
        }
        auVar6._8_8_ = 0;
        auVar6._0_8_ = *(long *)((long)secret + 0x48) - seed64 ^ *(ulong *)((long)input + 0x28);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = *(long *)((long)secret + 0x40) + seed64 ^ *(ulong *)((long)input + 0x20);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = *(long *)((long)secret + 0x58) - seed64 ^
                       *(ulong *)((long)input + (len - 0x28));
        auVar20._8_8_ = 0;
        auVar20._0_8_ =
             *(long *)((long)secret + 0x50) + seed64 ^ *(ulong *)((long)input + (len - 0x30));
        lVar33 = (SUB168(auVar7 * auVar20,8) ^ SUB168(auVar7 * auVar20,0)) +
                 (SUB168(auVar6 * auVar19,8) ^ SUB168(auVar6 * auVar19,0)) + lVar33;
      }
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(long *)((long)secret + 0x28) - seed64 ^ *(ulong *)((long)input + 0x18);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *(long *)((long)secret + 0x20) + seed64 ^ *(ulong *)((long)input + 0x10);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(long *)((long)secret + 0x38) - seed64 ^
                     *(ulong *)((long)input + (len - 0x18));
      auVar22._8_8_ = 0;
      auVar22._0_8_ =
           *(long *)((long)secret + 0x30) + seed64 ^ *(ulong *)((long)input + (len - 0x20));
      lVar33 = (SUB168(auVar9 * auVar22,8) ^ SUB168(auVar9 * auVar22,0)) +
               (SUB168(auVar8 * auVar21,8) ^ SUB168(auVar8 * auVar21,0)) + lVar33;
    }
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *(long *)((long)secret + 8) - seed64 ^ *(ulong *)((long)input + 8);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *secret + seed64 ^ *input;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *(long *)((long)secret + 0x18) - seed64 ^ *(ulong *)((long)input + (len - 8));
    auVar24._8_8_ = 0;
    auVar24._0_8_ = seed64 + *(long *)((long)secret + 0x10) ^ *(ulong *)((long)input + (len - 0x10))
    ;
    uVar31 = (SUB168(auVar11 * auVar24,8) ^ SUB168(auVar11 * auVar24,0)) +
             (SUB168(auVar10 * auVar23,8) ^ SUB168(auVar10 * auVar23,0)) + lVar33;
  }
  uVar31 = (uVar31 >> 0x25 ^ uVar31) * 0x165667919e3779f9;
  return uVar31 >> 0x20 ^ uVar31;
}

Assistant:

XXH_FORCE_INLINE XXH64_hash_t
XXH3_64bits_internal(const void* XXH_RESTRICT input, size_t len,
                     XXH64_hash_t seed64, const void* XXH_RESTRICT secret, size_t secretLen,
                     XXH3_hashLong64_f f_hashLong)
{
    XXH_ASSERT(secretLen >= XXH3_SECRET_SIZE_MIN);
    /*
     * If an action is to be taken if `secretLen` condition is not respected,
     * it should be done here.
     * For now, it's a contract pre-condition.
     * Adding a check and a branch here would cost performance at every hash.
     * Also, note that function signature doesn't offer room to return an error.
     */
    if (len <= 16)
        return XXH3_len_0to16_64b((const xxh_u8*)input, len, (const xxh_u8*)secret, seed64);
    if (len <= 128)
        return XXH3_len_17to128_64b((const xxh_u8*)input, len, (const xxh_u8*)secret, secretLen, seed64);
    if (len <= XXH3_MIDSIZE_MAX)
        return XXH3_len_129to240_64b((const xxh_u8*)input, len, (const xxh_u8*)secret, secretLen, seed64);
    return f_hashLong(input, len, seed64, (const xxh_u8*)secret, secretLen);
}